

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DlbaEncoder::WriteValue<unsigned_int>(DlbaEncoder *this,WriteStream *param_2,uint *param_3)

{
  InternalException *this_00;
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [56];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"DlbaEncoder should only be used with strings",&local_39);
  InternalException::InternalException(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void WriteValue(WriteStream &, const T &) {
		throw InternalException("DlbaEncoder should only be used with strings");
	}